

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O1

void __thiscall
musicBlock::OPLchangeControl(musicBlock *this,uint channel,uchar controller,int value)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  uint volume;
  undefined7 in_register_00000011;
  OPLio *pOVar4;
  ulong *puVar5;
  channelEntry *pcVar6;
  uchar uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (0x11 < (uint)CONCAT71(in_register_00000011,controller)) {
    return;
  }
  uVar9 = (ulong)channel;
  uVar7 = (uchar)value;
  uVar2 = (ushort)value;
  switch(CONCAT71(in_register_00000011,controller) & 0xffffffff) {
  case 0:
    (this->driverdata).channelInstr[uVar9] = value;
    break;
  case 2:
    (this->driverdata).channelModulation[uVar9] = uVar7;
    pOVar4 = this->io;
    if (pOVar4->OPLchannels != 0) {
      pcVar6 = this->channels;
      uVar9 = 0;
      do {
        if (pcVar6->channel == channel) {
          bVar1 = pcVar6->flags;
          pcVar6->time = this->MLtime;
          if (value < 0x28) {
            pcVar6->flags = bVar1 & 0xfb;
            if ((bVar1 & 0xfb) != bVar1) {
              OPLio::OPLwriteChannel
                        (pOVar4,0x20,(uint)uVar9,pcVar6->instr->trem_vibr_1,
                         pcVar6->instr->trem_vibr_2);
            }
          }
          else {
            pcVar6->flags = bVar1 | 4;
            if ((bVar1 | 4) != bVar1) {
              writeModulation(this,(uint)uVar9,pcVar6->instr,1);
            }
          }
        }
        uVar9 = uVar9 + 1;
        pOVar4 = this->io;
        pcVar6 = pcVar6 + 1;
      } while (uVar9 < pOVar4->OPLchannels);
    }
    break;
  case 3:
    lVar3 = 0x54;
    goto LAB_0031a088;
  case 4:
    (this->driverdata).channelPan[uVar9] = (schar)(value + -0x40);
    pOVar4 = this->io;
    if (pOVar4->OPLchannels != 0) {
      puVar5 = &this->channels[0].time;
      uVar9 = 0;
      do {
        if (((channelEntry *)(puVar5 + -4))->channel == channel) {
          *puVar5 = this->MLtime;
          OPLio::OPLwritePan(pOVar4,(uint)uVar9,(OPL2instrument *)puVar5[-1],value + -0x40);
        }
        uVar9 = uVar9 + 1;
        pOVar4 = this->io;
        puVar5 = puVar5 + 5;
      } while (uVar9 < pOVar4->OPLchannels);
    }
    break;
  case 5:
    lVar3 = 0xf4;
LAB_0031a088:
    *(uchar *)((long)(this->driverdata).channelInstr + uVar9 + lVar3 + -0x14) = uVar7;
    pOVar4 = this->io;
    if (pOVar4->OPLchannels != 0) {
      puVar5 = &this->channels[0].time;
      uVar8 = 0;
      do {
        if (((channelEntry *)(puVar5 + -4))->channel == channel) {
          *puVar5 = this->MLtime;
          volume = (uint)(((ulong)*(uint *)((long)puVar5 + -0x14) *
                          (ulong)(this->driverdata).channelExpression[uVar9] *
                          (ulong)(this->driverdata).channelVolume[uVar9]) / 0x3f01);
          if (0x7e < volume) {
            volume = 0x7f;
          }
          *(uint *)(puVar5 + -2) = volume;
          OPLio::OPLwriteVolume(pOVar4,(uint)uVar8,(OPL2instrument *)puVar5[-1],volume);
        }
        uVar8 = uVar8 + 1;
        pOVar4 = this->io;
        puVar5 = puVar5 + 5;
      } while (uVar8 < pOVar4->OPLchannels);
    }
    break;
  case 8:
    (this->driverdata).channelSustain[uVar9] = uVar7;
    if (value < 0x40) {
      releaseSustain(this,channel);
      return;
    }
    break;
  case 10:
    (this->driverdata).channelRPN[uVar9] =
         (ushort)(value << 7) | (this->driverdata).channelRPN[uVar9] & 0x7f;
    break;
  case 0xb:
    (this->driverdata).channelRPN[uVar9] = (this->driverdata).channelRPN[uVar9] & 0x3f80 | uVar2;
    break;
  case 0xc:
  case 0xd:
    (this->driverdata).channelRPN[uVar9] = 0x3fff;
    break;
  case 0xe:
    if ((this->driverdata).channelRPN[uVar9] == 0) {
      (this->driverdata).channelPitchSens[uVar9] =
           uVar2 * 100 + (this->driverdata).channelPitchSens[uVar9] % 100;
    }
    break;
  case 0xf:
    if ((this->driverdata).channelRPN[uVar9] == 0) {
      (this->driverdata).channelPitchSens[uVar9] =
           ((this->driverdata).channelPitchSens[uVar9] / 100) * 100 + uVar2;
    }
    break;
  case 0x10:
    pOVar4 = this->io;
    if (pOVar4->OPLchannels != 0) {
      pcVar6 = this->channels;
      uVar9 = 0;
      do {
        if (pcVar6->channel == channel) {
          OPLio::OPLwriteFreq(pOVar4,(uint)uVar9,(uint)pcVar6->realnote,pcVar6->pitch,0);
          pcVar6->channel = pcVar6->channel | 0x80;
          pcVar6->time = this->MLtime;
          pcVar6->flags = 0x80;
        }
        uVar9 = uVar9 + 1;
        pOVar4 = this->io;
        pcVar6 = pcVar6 + 1;
      } while (uVar9 < pOVar4->OPLchannels);
    }
    break;
  case 0x11:
    pOVar4 = this->io;
    if (pOVar4->OPLchannels != 0) {
      pcVar6 = this->channels;
      uVar8 = 0;
      do {
        if (pcVar6->channel == channel) {
          if ((this->driverdata).channelSustain[uVar9] < 0x40) {
            OPLio::OPLwriteFreq(pOVar4,(uint)uVar8,(uint)pcVar6->realnote,pcVar6->pitch,0);
            pcVar6->channel = pcVar6->channel | 0x80;
            pcVar6->time = this->MLtime;
            pcVar6->flags = 0x80;
          }
          else {
            pcVar6->flags = pcVar6->flags | 2;
          }
        }
        uVar8 = uVar8 + 1;
        pOVar4 = this->io;
        pcVar6 = pcVar6 + 1;
      } while (uVar8 < pOVar4->OPLchannels);
    }
  }
  return;
}

Assistant:

void musicBlock::OPLchangeControl(uint channel, uchar controller, int value)
{
	uint i;
	uint id = channel;

	switch (controller)
	{
	case ctrlPatch:			/* change instrument */
		OPLprogramChange(channel, value);
		break;

	case ctrlModulation:
		driverdata.channelModulation[channel] = value;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				uchar flags = ch->flags;
				ch->time = MLtime;
				if (value >= MOD_MIN)
				{
					ch->flags |= CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 1);
				} else {
					ch->flags &= ~CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 0);
				}
			}
		}
		break;

	case ctrlVolume:		/* change volume */
		driverdata.channelVolume[channel] = value;
		/* fall-through */
	case ctrlExpression:	/* change expression */
		if (controller == ctrlExpression)
		{
			driverdata.channelExpression[channel] = value;
		}
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				ch->realvolume = calcVolume(driverdata.channelVolume[channel],
					driverdata.channelExpression[channel], ch->volume);
				io->OPLwriteVolume(i, ch->instr, ch->realvolume);
			}
		}
		break;

	case ctrlPan:			/* change pan (balance) */
		driverdata.channelPan[channel] = value -= 64;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				io->OPLwritePan(i, ch->instr, value);
			}
		}
		break;

	case ctrlSustainPedal:		/* change sustain pedal (hold) */
		driverdata.channelSustain[channel] = value;
		if (value < 0x40)
			releaseSustain(channel);
		break;

	case ctrlNotesOff:			/* turn off all notes that are not sustained */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				if (driverdata.channelSustain[id] < 0x40)
					releaseChannel(i, 0);
				else
					channels[i].flags |= CH_SUSTAIN;
			}
		}
		break;

	case ctrlSoundsOff:			/* release all notes for this channel */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				releaseChannel(i, 0);
			}
		}
		break;

	case ctrlRPNHi:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x007F) | (value << 7);
		break;

	case ctrlRPNLo:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x3F80) | value;
		break;

	case ctrlNRPNLo:
	case ctrlNRPNHi:
		driverdata.channelRPN[id] = 0x3FFF;
		break;

	case ctrlDataEntryHi:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value * 100 + (driverdata.channelPitchSens[id] % 100);
		}
		break;

	case ctrlDataEntryLo:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value + (driverdata.channelPitchSens[id] / 100) * 100;
		}
		break;
	}
}